

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O3

Dic<asl::String> * __thiscall
asl::Map<asl::String,_asl::Dic<asl::String>_>::operator[]
          (Map<asl::String,_asl::Dic<asl::String>_> *this,String *key)

{
  KeyVal *pKVar1;
  uint uVar2;
  int iVar3;
  Dic<asl::String> *pDVar4;
  
  uVar2 = indexOf(this,key);
  pKVar1 = (this->a)._a;
  if (Map<asl::String,asl::Dic<asl::String>>::operator[](asl::String_const&)::def == '\0') {
    iVar3 = __cxa_guard_acquire(&Map<asl::String,asl::Dic<asl::String>>::
                                 operator[](asl::String_const&)::def);
    if (iVar3 != 0) {
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc
                ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&operator[]::def,0);
      __cxa_atexit(Map<asl::String,_asl::String>::~Map,&operator[]::def,&__dso_handle);
      __cxa_guard_release(&Map<asl::String,asl::Dic<asl::String>>::operator[](asl::String_const&)::
                           def);
    }
  }
  if ((int)uVar2 < 0) {
    pDVar4 = &operator[]::def;
  }
  else {
    pDVar4 = &pKVar1[uVar2].value;
  }
  return pDVar4;
}

Assistant:

const T& operator[](const K& key) const
	{
		const T* p = find(key);
		static T def = T();
		return p ? *p : def;
	}